

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

StatusOr<absl::lts_20240722::Span<char>_> * __thiscall
google::protobuf::json_internal::anon_unknown_5::DecodeBase64InPlace
          (StatusOr<absl::lts_20240722::Span<char>_> *__return_storage_ptr__,anon_unknown_5 *this,
          Span<char> base64)

{
  char *pcVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer pcVar6;
  size_type sVar7;
  pointer pcVar8;
  Span<char> local_80 [2];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  Status local_50;
  uint local_48;
  uint local_44;
  uint32_t val_1;
  uint32_t val;
  char *end4;
  char *end;
  char *ptr;
  char *out;
  Span<char> base64_local;
  
  base64_local.ptr_ = base64.ptr_;
  out = (char *)this;
  base64_local.len_ = (size_type)__return_storage_ptr__;
  ptr = absl::lts_20240722::Span<char>::data((Span<char> *)&out);
  pcVar6 = absl::lts_20240722::Span<char>::data((Span<char> *)&out);
  end = pcVar6;
  sVar7 = absl::lts_20240722::Span<char>::size((Span<char> *)&out);
  pcVar1 = end;
  end4 = pcVar6 + sVar7;
  sVar7 = absl::lts_20240722::Span<char>::size((Span<char> *)&out);
  _val_1 = pcVar1 + (sVar7 & 0xfffffffc);
  do {
    if (_val_1 <= end) {
LAB_004b8532:
      if (end < end4) {
        local_48 = 0xffffffff;
        if ((long)end4 - (long)end == 2) {
          uVar2 = Base64Lookup(*end);
          uVar3 = Base64Lookup(end[1]);
          local_48 = uVar2 << 0x12 | uVar3 << 0xc;
          *ptr = (char)(local_48 >> 0x10);
          ptr = ptr + 1;
        }
        else if ((long)end4 - (long)end == 3) {
          uVar2 = Base64Lookup(*end);
          uVar3 = Base64Lookup(end[1]);
          uVar4 = Base64Lookup(end[2]);
          local_48 = uVar2 << 0x12 | uVar3 << 0xc | uVar4 << 6;
          *ptr = (char)(local_48 >> 0x10);
          ptr[1] = (char)(local_48 >> 8);
          ptr = ptr + 2;
        }
        if ((int)local_48 < 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_60,"corrupt base64");
          absl::lts_20240722::InvalidArgumentError(&local_50,local_60._M_len,local_60._M_str);
          absl::lts_20240722::StatusOr<absl::lts_20240722::Span<char>_>::
          StatusOr<absl::lts_20240722::Status,_0>(__return_storage_ptr__,&local_50);
          absl::lts_20240722::Status::~Status(&local_50);
          return __return_storage_ptr__;
        }
      }
      pcVar6 = absl::lts_20240722::Span<char>::data((Span<char> *)&out);
      pcVar1 = ptr;
      pcVar8 = absl::lts_20240722::Span<char>::data((Span<char> *)&out);
      absl::lts_20240722::Span<char>::Span(local_80,pcVar6,(long)pcVar1 - (long)pcVar8);
      absl::lts_20240722::StatusOr<absl::lts_20240722::Span<char>_>::
      StatusOr<absl::lts_20240722::Span<char>,_0>(__return_storage_ptr__,local_80);
      return __return_storage_ptr__;
    }
    uVar2 = Base64Lookup(*end);
    uVar3 = Base64Lookup(end[1]);
    uVar4 = Base64Lookup(end[2]);
    uVar5 = Base64Lookup(end[3]);
    local_44 = uVar2 << 0x12 | uVar3 << 0xc | uVar4 << 6 | uVar5;
    if ((int)local_44 < 0) {
      if (((long)end4 - (long)end == 4) && (end[3] == '=')) {
        if (end[2] == '=') {
          end4 = end4 + -2;
        }
        else {
          end4 = end4 + -1;
        }
      }
      goto LAB_004b8532;
    }
    *ptr = (char)(local_44 >> 0x10);
    ptr[1] = (char)(local_44 >> 8);
    ptr[2] = (char)local_44;
    end = end + 4;
    ptr = ptr + 3;
  } while( true );
}

Assistant:

absl::StatusOr<absl::Span<char>> DecodeBase64InPlace(absl::Span<char> base64) {
  // We decode in place. This is safe because this is a new buffer (not
  // aliasing the input) and because base64 decoding shrinks 4 bytes into 3.
  char* out = base64.data();
  const char* ptr = base64.data();
  const char* end = ptr + base64.size();
  const char* end4 = ptr + (base64.size() & ~3u);

  for (; ptr < end4; ptr += 4, out += 3) {
    auto val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12 |
               Base64Lookup(ptr[2]) << 6 | Base64Lookup(ptr[3]) << 0;

    if (static_cast<int32_t>(val) < 0) {
      // Junk chars or padding. Remove trailing padding, if any.
      if (end - ptr == 4 && ptr[3] == '=') {
        if (ptr[2] == '=') {
          end -= 2;
        } else {
          end -= 1;
        }
      }
      break;
    }

    out[0] = val >> 16;
    out[1] = (val >> 8) & 0xff;
    out[2] = val & 0xff;
  }

  if (ptr < end) {
    uint32_t val = ~0u;
    switch (end - ptr) {
      case 2:
        val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12;
        out[0] = val >> 16;
        out += 1;
        break;
      case 3:
        val = Base64Lookup(ptr[0]) << 18 | Base64Lookup(ptr[1]) << 12 |
              Base64Lookup(ptr[2]) << 6;
        out[0] = val >> 16;
        out[1] = (val >> 8) & 0xff;
        out += 2;
        break;
    }

    if (static_cast<int32_t>(val) < 0) {
      return absl::InvalidArgumentError("corrupt base64");
    }
  }

  return absl::Span<char>(base64.data(),
                          static_cast<size_t>(out - base64.data()));
}